

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O3

void __thiscall DObject::SerializeUserVars(DObject *this,FSerializer *arc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *this_00;
  
  this_00 = this->Class;
  if (arc->w != (FWriter *)0x0) {
    if (this_00 == (PClass *)0x0) {
      iVar1 = (**this->_vptr_DObject)(this);
      this_00 = (PClass *)CONCAT44(extraout_var,iVar1);
      this->Class = this_00;
    }
    PClass::WriteAllFields(this_00,arc,this);
    return;
  }
  if (this_00 == (PClass *)0x0) {
    iVar1 = (**this->_vptr_DObject)(this);
    this_00 = (PClass *)CONCAT44(extraout_var_00,iVar1);
    this->Class = this_00;
  }
  PClass::ReadAllFields(this_00,arc,this);
  return;
}

Assistant:

void DObject::SerializeUserVars(FSerializer &arc)
{
	if (arc.isWriting())
	{
		// Write all fields that aren't serialized by native code.
		GetClass()->WriteAllFields(arc, this);
	}
	else
	{
		GetClass()->ReadAllFields(arc, this);
	}
}